

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  bool bVar2;
  cmListFileParser parser;
  allocator local_d9;
  string local_d8;
  cmListFileParser local_b8;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  bVar2 = true;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_d8,filename,&local_d9);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 == false) {
    cmListFileParser::cmListFileParser(&local_b8,this,lfbt,messenger,filename);
    bVar2 = cmListFileParser::ParseFile(&local_b8);
    cmListFileParser::~cmListFileParser(&local_b8);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}